

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ConstantExpression::Copy(ConstantExpression *this)

{
  ConstantExpression *this_00;
  pointer pCVar1;
  pointer *__ptr;
  long in_RSI;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_68;
  Value local_60;
  
  this_00 = (ConstantExpression *)operator_new(0x78);
  Value::Value(&local_60,(Value *)(in_RSI + 0x38));
  ConstantExpression(this_00,&local_60);
  local_68._M_head_impl = this_00;
  Value::~Value(&local_60);
  pCVar1 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                         *)&local_68);
  (pCVar1->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pCVar1->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar1->super_ParsedExpression).super_BaseExpression.alias);
  (pCVar1->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_68._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ConstantExpression::Copy() const {
	auto copy = make_uniq<ConstantExpression>(value);
	copy->CopyProperties(*this);
	return std::move(copy);
}